

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

int32_t spvOpcodeIsScalarType(Op opcode)

{
  uint local_c;
  Op opcode_local;
  
  local_c = (uint)(opcode - OpTypeBool < 3);
  return local_c;
}

Assistant:

int32_t spvOpcodeIsScalarType(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
    case spv::Op::OpTypeBool:
      return true;
    default:
      return false;
  }
}